

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O3

Vector3fi * __thiscall
pbrt::Transform::operator()(Vector3fi *__return_storage_ptr__,Transform *this,Vector3fi *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  float fVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Tuple3<pbrt::Vector3,_float> local_20;
  Vector3f local_14;
  
  fVar1 = (v->super_Vector3<pbrt::Interval<float>_>).
          super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x.low;
  fVar2 = (v->super_Vector3<pbrt::Interval<float>_>).
          super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.y.high;
  uVar9 = *(ulong *)&(v->super_Vector3<pbrt::Interval<float>_>).
                     super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x.high;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar9;
  fVar15 = (v->super_Vector3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z.low;
  fVar3 = (v->super_Vector3<pbrt::Interval<float>_>).
          super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z.high;
  auVar14 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2),0x10);
  fVar11 = (fVar15 + fVar3) * 0.5;
  fVar1 = (float)uVar9 - fVar1;
  auVar13._0_4_ = (float)uVar9 + auVar14._0_4_;
  auVar13._4_4_ = (float)(uVar9 >> 0x20) + auVar14._4_4_;
  auVar13._8_4_ = auVar14._8_4_ + 0.0;
  auVar13._12_4_ = auVar14._12_4_ + 0.0;
  auVar14._8_4_ = 0x3f000000;
  auVar14._0_8_ = 0x3f0000003f000000;
  auVar14._12_4_ = 0x3f000000;
  auVar13 = vmulps_avx512vl(auVar13,auVar14);
  auVar14 = vmovshdup_avx(auVar17);
  fVar2 = fVar2 - auVar14._0_4_;
  fVar3 = fVar3 - fVar15;
  fVar15 = auVar13._0_4_;
  if ((((fVar1 != 0.0) || (fVar2 != 0.0)) || (fVar3 != 0.0)) || (NAN(fVar3))) {
    auVar29._8_4_ = 0x7fffffff;
    auVar29._0_8_ = 0x7fffffff7fffffff;
    auVar29._12_4_ = 0x7fffffff;
    auVar17 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 1),
                            ZEXT416((uint)(this->m).m[1][1]),0x10);
    fVar3 = fVar3 * 0.5;
    fVar1 = fVar1 * 0.5;
    FVar4 = (this->m).m[0][0];
    FVar5 = (this->m).m[1][0];
    fVar2 = fVar2 * 0.5;
    FVar6 = (this->m).m[0][2];
    FVar7 = (this->m).m[1][2];
    auVar14 = vandps_avx(auVar29,auVar17);
    auVar32._4_4_ = fVar3;
    auVar32._0_4_ = fVar3;
    auVar32._8_4_ = fVar3;
    auVar32._12_4_ = fVar3;
    auVar30._0_4_ = fVar2 * auVar14._0_4_;
    auVar30._4_4_ = fVar2 * auVar14._4_4_;
    auVar30._8_4_ = fVar2 * auVar14._8_4_;
    auVar30._12_4_ = fVar2 * auVar14._12_4_;
    auVar31._4_4_ = fVar1;
    auVar31._0_4_ = fVar1;
    auVar31._8_4_ = fVar1;
    auVar31._12_4_ = fVar1;
    auVar10 = vinsertps_avx(ZEXT416((uint)FVar4),ZEXT416((uint)FVar5),0x10);
    auVar14 = vandps_avx(auVar29,auVar10);
    auVar24 = vfmadd213ps_fma(auVar31,auVar14,auVar30);
    auVar16 = vinsertps_avx(ZEXT416((uint)FVar6),ZEXT416((uint)FVar7),0x10);
    auVar14 = vandps_avx(auVar16,auVar29);
    auVar24 = vfmadd213ps_fma(auVar32,auVar14,auVar24);
    auVar21._0_4_ = fVar15 * auVar10._0_4_;
    auVar21._4_4_ = fVar15 * auVar10._4_4_;
    auVar21._8_4_ = fVar15 * auVar10._8_4_;
    auVar21._12_4_ = fVar15 * auVar10._12_4_;
    auVar14 = vmovshdup_avx(auVar13);
    auVar18._0_4_ = auVar14._0_4_ * auVar17._0_4_;
    auVar18._4_4_ = auVar14._4_4_ * auVar17._4_4_;
    auVar18._8_4_ = auVar14._8_4_ * auVar17._8_4_;
    auVar18._12_4_ = auVar14._12_4_ * auVar17._12_4_;
    auVar14 = vandps_avx(auVar29,auVar21);
    auVar17 = vandps_avx(auVar29,auVar18);
    auVar25._0_4_ = fVar11 * auVar16._0_4_;
    auVar25._4_4_ = fVar11 * auVar16._4_4_;
    auVar25._8_4_ = fVar11 * auVar16._8_4_;
    auVar25._12_4_ = fVar11 * auVar16._12_4_;
    auVar10 = vandps_avx(auVar25,auVar29);
    auVar22._0_4_ = auVar10._0_4_ + auVar17._0_4_ + auVar14._0_4_;
    auVar22._4_4_ = auVar10._4_4_ + auVar17._4_4_ + auVar14._4_4_;
    auVar22._8_4_ = auVar10._8_4_ + auVar17._8_4_ + auVar14._8_4_;
    auVar22._12_4_ = auVar10._12_4_ + auVar17._12_4_ + auVar14._12_4_;
    auVar10._8_4_ = 0x34400002;
    auVar10._0_8_ = 0x3440000234400002;
    auVar10._12_4_ = 0x34400002;
    auVar14 = vmulps_avx512vl(auVar22,auVar10);
    auVar16._8_4_ = 0x3f800002;
    auVar16._0_8_ = 0x3f8000023f800002;
    auVar16._12_4_ = 0x3f800002;
    auVar14 = vfmadd231ps_avx512vl(auVar14,auVar24,auVar16);
    local_20._0_8_ = vmovlps_avx(auVar14);
    uVar9 = *(ulong *)(this->m).m[2];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar9;
    fVar8 = (this->m).m[2][2];
    auVar10 = vmovshdup_avx(auVar24);
    auVar14 = vandps_avx(auVar24,auVar29);
    auVar17 = vandps_avx(auVar29,ZEXT416((uint)fVar8));
    auVar10 = vandps_avx(auVar10,auVar29);
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * auVar10._0_4_)),ZEXT416((uint)fVar1),auVar14);
    auVar27._0_4_ = (float)uVar9 * fVar15;
    auVar27._4_4_ = (float)(uVar9 >> 0x20) * auVar13._4_4_;
    auVar27._8_4_ = auVar13._8_4_ * 0.0;
    auVar27._12_4_ = auVar13._12_4_ * 0.0;
    auVar14 = vandps_avx(auVar27,auVar29);
    auVar10 = vmovshdup_avx(auVar27);
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar3),auVar17);
    auVar17 = vhaddps_avx(auVar14,auVar14);
    auVar14 = vandps_avx(ZEXT416((uint)(fVar11 * fVar8)),auVar29);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)((auVar17._0_4_ + auVar14._0_4_) * 1.7881396e-07)),
                              auVar16,ZEXT416(0x3f800002));
    local_20.z = auVar14._0_4_;
  }
  else {
    FVar4 = (this->m).m[0][0];
    FVar5 = (this->m).m[1][0];
    auVar26._8_4_ = 0x7fffffff;
    auVar26._0_8_ = 0x7fffffff7fffffff;
    auVar26._12_4_ = 0x7fffffff;
    FVar6 = (this->m).m[0][2];
    FVar7 = (this->m).m[1][2];
    auVar14 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 1),
                            ZEXT416((uint)(this->m).m[1][1]),0x10);
    auVar17 = vinsertps_avx(ZEXT416((uint)FVar4),ZEXT416((uint)FVar5),0x10);
    auVar10 = vinsertps_avx(ZEXT416((uint)FVar6),ZEXT416((uint)FVar7),0x10);
    auVar19._0_4_ = auVar17._0_4_ * fVar15;
    auVar19._4_4_ = auVar17._4_4_ * fVar15;
    auVar19._8_4_ = auVar17._8_4_ * fVar15;
    auVar19._12_4_ = auVar17._12_4_ * fVar15;
    auVar17 = vmovshdup_avx(auVar13);
    auVar18._0_4_ = auVar17._0_4_ * auVar14._0_4_;
    auVar18._4_4_ = auVar17._4_4_ * auVar14._4_4_;
    auVar18._8_4_ = auVar17._8_4_ * auVar14._8_4_;
    auVar18._12_4_ = auVar17._12_4_ * auVar14._12_4_;
    auVar14 = vandps_avx(auVar26,auVar19);
    auVar17 = vandps_avx(auVar26,auVar18);
    auVar23._0_4_ = fVar11 * auVar10._0_4_;
    auVar23._4_4_ = fVar11 * auVar10._4_4_;
    auVar23._8_4_ = fVar11 * auVar10._8_4_;
    auVar23._12_4_ = fVar11 * auVar10._12_4_;
    auVar10 = vandps_avx(auVar23,auVar26);
    auVar20._0_4_ = auVar10._0_4_ + auVar17._0_4_ + auVar14._0_4_;
    auVar20._4_4_ = auVar10._4_4_ + auVar17._4_4_ + auVar14._4_4_;
    auVar20._8_4_ = auVar10._8_4_ + auVar17._8_4_ + auVar14._8_4_;
    auVar20._12_4_ = auVar10._12_4_ + auVar17._12_4_ + auVar14._12_4_;
    auVar12._8_4_ = 0x34400002;
    auVar12._0_8_ = 0x3440000234400002;
    auVar12._12_4_ = 0x34400002;
    auVar14 = vmulps_avx512vl(auVar20,auVar12);
    local_20._0_8_ = vmovlps_avx(auVar14);
    uVar9 = *(ulong *)(this->m).m[2];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar9;
    auVar28._0_4_ = (float)uVar9 * fVar15;
    auVar28._4_4_ = (float)(uVar9 >> 0x20) * auVar13._4_4_;
    auVar28._8_4_ = auVar13._8_4_ * 0.0;
    auVar28._12_4_ = auVar13._12_4_ * 0.0;
    auVar14 = vandps_avx(auVar28,auVar26);
    auVar17 = vhaddps_avx(auVar14,auVar14);
    fVar8 = (this->m).m[2][2];
    auVar14 = vandps_avx(ZEXT416((uint)(fVar11 * fVar8)),auVar26);
    local_20.z = (auVar17._0_4_ + auVar14._0_4_) * 1.7881396e-07;
    auVar10 = vmovshdup_avx(auVar28);
  }
  auVar14 = vmovshdup_avx(auVar18);
  auVar17 = vfmadd231ss_fma(auVar18,auVar13,ZEXT416((uint)FVar4));
  auVar10 = vfmadd231ss_fma(auVar10,auVar13,auVar24);
  auVar14 = vfmadd231ss_fma(auVar14,auVar13,ZEXT416((uint)FVar5));
  auVar16 = ZEXT416((uint)fVar11);
  auVar13 = vfmadd231ss_fma(auVar17,auVar16,ZEXT416((uint)FVar6));
  auVar17 = vfmadd231ss_fma(auVar10,auVar16,ZEXT416((uint)fVar8));
  auVar14 = vfmadd231ss_fma(auVar14,auVar16,ZEXT416((uint)FVar7));
  local_14.super_Tuple3<pbrt::Vector3,_float>.x = auVar13._0_4_;
  local_14.super_Tuple3<pbrt::Vector3,_float>.y = auVar14._0_4_;
  local_14.super_Tuple3<pbrt::Vector3,_float>.z = auVar17._0_4_;
  Vector3fi::Vector3fi(__return_storage_ptr__,&local_14,(Vector3f *)&local_20);
  return __return_storage_ptr__;
}

Assistant:

inline Vector3fi Transform::operator()(const Vector3fi &v) const {
    Float x = Float(v.x), y = Float(v.y), z = Float(v.z);
    Vector3f vOutError;
    if (v.IsExact()) {
        vOutError.x = gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                  std::abs(m[0][2] * z));
        vOutError.y = gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                  std::abs(m[1][2] * z));
        vOutError.z = gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                  std::abs(m[2][2] * z));
    } else {
        Vector3f vInError = v.Error();
        vOutError.x = (gamma(3) + 1) * (std::abs(m[0][0]) * vInError.x +
                                        std::abs(m[0][1]) * vInError.y +
                                        std::abs(m[0][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                  std::abs(m[0][2] * z));
        vOutError.y = (gamma(3) + 1) * (std::abs(m[1][0]) * vInError.x +
                                        std::abs(m[1][1]) * vInError.y +
                                        std::abs(m[1][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                  std::abs(m[1][2] * z));
        vOutError.z = (gamma(3) + 1) * (std::abs(m[2][0]) * vInError.x +
                                        std::abs(m[2][1]) * vInError.y +
                                        std::abs(m[2][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                  std::abs(m[2][2] * z));
    }

    Float xp = m[0][0] * x + m[0][1] * y + m[0][2] * z;
    Float yp = m[1][0] * x + m[1][1] * y + m[1][2] * z;
    Float zp = m[2][0] * x + m[2][1] * y + m[2][2] * z;

    return Vector3fi(Vector3f(xp, yp, zp), vOutError);
}